

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O0

void __thiscall CNetServer::Drop(CNetServer *this,int ClientID,char *pReason)

{
  int iVar1;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((-1 < in_ESI) && (in_ESI < 0x40)) &&
     (iVar1 = CNetConnection::State((CNetConnection *)(in_RDI + 0x4258 + (long)in_ESI * 0x8718)),
     iVar1 != 0)) {
    if (*(long *)(in_RDI + 0x220870) != 0) {
      (**(code **)(in_RDI + 0x220870))(in_ESI,in_RDX,*(undefined8 *)(in_RDI + 0x220878));
    }
    CNetConnection::Disconnect((CNetConnection *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    *(int *)(in_RDI + 0x220858) = *(int *)(in_RDI + 0x220858) + -1;
  }
  return;
}

Assistant:

void CNetServer::Drop(int ClientID, const char *pReason)
{
	if(ClientID < 0 || ClientID >= NET_MAX_CLIENTS || m_aSlots[ClientID].m_Connection.State() == NET_CONNSTATE_OFFLINE)
		return;

	if(m_pfnDelClient)
		m_pfnDelClient(ClientID, pReason, m_UserPtr);

	m_aSlots[ClientID].m_Connection.Disconnect(pReason);
	m_NumClients--;
}